

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterferentGraphBuilder.cpp
# Opt level: O1

void addEdgesFromNotMoveLine
               (CodeLine *line,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *graph,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *ignoreList)

{
  pointer pcVar1;
  bool bVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  bool bVar7;
  bool bVar8;
  string def;
  string out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> outTemp;
  CTemp defTemp;
  string local_170;
  CodeLine *local_150;
  string local_148;
  undefined1 *local_128;
  size_t local_120;
  undefined1 local_118 [16];
  CTemp local_108;
  undefined1 *local_e8;
  pointer local_e0;
  pointer local_d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *local_d0;
  string local_c8;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  string local_68;
  vector<IRT::CTemp,_std::allocator<IRT::CTemp>_> local_48;
  
  local_150 = line;
  local_d0 = graph;
  (*((line->command).super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_AssemblyCommand[1])(&local_48);
  local_e0 = local_48.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_48.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    psVar3 = &local_150->liveOutTemps;
    local_e8 = local_78;
    do {
      local_108.name._M_dataplus._M_p = (pointer)&local_108.name.field_2;
      pcVar1 = ((local_48.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
                 super__Vector_impl_data._M_start)->name)._M_dataplus._M_p;
      local_d8 = local_48.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
                 super__Vector_impl_data._M_start;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,pcVar1,
                 pcVar1 + ((local_48.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>.
                            _M_impl.super__Vector_impl_data._M_start)->name)._M_string_length);
      for (p_Var5 = (local_150->liveOutTemps)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &(psVar3->_M_t)._M_impl.super__Rb_tree_header;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        local_128 = local_118;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128,*(long *)(p_Var5 + 1),
                   (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
        IRT::CTemp::ToString_abi_cxx11_(&local_170,&local_108);
        bVar7 = true;
        if (local_170._M_string_length == local_120) {
          if (local_170._M_string_length == 0) {
            bVar7 = false;
          }
          else {
            iVar4 = bcmp(local_170._M_dataplus._M_p,local_128,local_170._M_string_length);
            bVar7 = iVar4 != 0;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        if (bVar7) {
          IRT::CTemp::ToString_abi_cxx11_(&local_170,&local_108);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_128,local_128 + local_120);
          bVar7 = isInIgnoreList(&local_170);
          if ((bVar7) || (bVar7 = isInIgnoreList(&local_148), bVar7)) {
            bVar7 = false;
LAB_001558a6:
            bVar2 = false;
            bVar8 = false;
          }
          else {
            local_88[0] = local_78;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_88,local_170._M_dataplus._M_p,
                       local_170._M_dataplus._M_p + local_170._M_string_length);
            _Var6 = std::
                    __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                              ((ignoreList->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start,
                               (ignoreList->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish,local_88);
            if (_Var6._M_current !=
                (ignoreList->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              bVar7 = true;
              goto LAB_001558a6;
            }
            local_a8[0] = local_98;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_a8,local_148._M_dataplus._M_p,
                       local_148._M_dataplus._M_p + local_148._M_string_length);
            _Var6 = std::
                    __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                              ((ignoreList->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start,
                               (ignoreList->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish,local_a8);
            bVar8 = _Var6._M_current ==
                    (ignoreList->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
            bVar7 = true;
            bVar2 = true;
          }
          if ((bVar2) && (local_a8[0] != local_98)) {
            operator_delete(local_a8[0]);
          }
          if ((bVar7) && (local_88[0] != local_78)) {
            operator_delete(local_88[0]);
          }
          if (bVar8) {
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c8,local_170._M_dataplus._M_p,
                       local_170._M_dataplus._M_p + local_170._M_string_length);
            local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_68,local_148._M_dataplus._M_p,
                       local_148._M_dataplus._M_p + local_148._M_string_length);
            AssemblyCode::addNotOrientedEdge(&local_c8,&local_68,local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
              operator_delete(local_c8._M_dataplus._M_p);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            operator_delete(local_148._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
          }
        }
        if (local_128 != local_118) {
          operator_delete(local_128);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108.name._M_dataplus._M_p != &local_108.name.field_2) {
        operator_delete(local_108.name._M_dataplus._M_p);
      }
      local_48.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
      super__Vector_impl_data._M_start = local_d8 + 1;
    } while (local_48.super__Vector_base<IRT::CTemp,_std::allocator<IRT::CTemp>_>._M_impl.
             super__Vector_impl_data._M_start != local_e0);
  }
  std::vector<IRT::CTemp,_std::allocator<IRT::CTemp>_>::~vector(&local_48);
  return;
}

Assistant:

void addEdgesFromNotMoveLine(AssemblyCode::CodeLine& line, std::map<std::string, std::set<std::string>>& graph,
                             std::vector<std::string>& ignoreList) {
    for (auto defTemp : line.command->GetOut()) {
        for (auto outTemp : line.liveOutTemps) {
            if (defTemp.ToString() != outTemp) {
                std::string def = defTemp.ToString( );
                std::string out = outTemp;
                if ( !isInIgnoreList( def ) && !isInIgnoreList( out ) && !isInDynamicIgnoreList(def, ignoreList) && !isInDynamicIgnoreList(out, ignoreList)) {
                    AssemblyCode::addNotOrientedEdge( def, out, graph );
                }
            }
        }
    }
}